

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# real_fourier_ooura.cc
# Opt level: O0

void __thiscall webrtc::RealFourierOoura::RealFourierOoura(RealFourierOoura *this,int fft_order)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  size_t sVar3;
  ulong uVar4;
  unsigned_long *__p;
  float *__p_00;
  FatalMessage local_1a8;
  string *local_30;
  string *_result;
  int local_14;
  RealFourierOoura *pRStack_10;
  int fft_order_local;
  RealFourierOoura *this_local;
  
  local_14 = fft_order;
  pRStack_10 = this;
  RealFourier::RealFourier(&this->super_RealFourier);
  (this->super_RealFourier)._vptr_RealFourier = (_func_int **)&PTR__RealFourierOoura_002fb718;
  this->order_ = local_14;
  sVar3 = RealFourier::FftLength(this->order_);
  this->length_ = sVar3;
  sVar3 = RealFourier::ComplexLength(this->order_);
  this->complex_length_ = sVar3;
  sVar3 = anon_unknown_2::ComputeWorkIpSize(this->length_);
  auVar1._8_8_ = 0;
  auVar1._0_8_ = sVar3;
  uVar4 = SUB168(auVar1 * ZEXT816(8),0);
  if (SUB168(auVar1 * ZEXT816(8),8) != 0) {
    uVar4 = 0xffffffffffffffff;
  }
  __p = (unsigned_long *)operator_new__(uVar4);
  memset(__p,0,uVar4);
  std::unique_ptr<unsigned_long[],std::default_delete<unsigned_long[]>>::
  unique_ptr<unsigned_long*,std::default_delete<unsigned_long[]>,void,bool>
            ((unique_ptr<unsigned_long[],std::default_delete<unsigned_long[]>> *)&this->work_ip_,__p
            );
  auVar2._8_8_ = 0;
  auVar2._0_8_ = this->complex_length_;
  uVar4 = SUB168(auVar2 * ZEXT816(4),0);
  if (SUB168(auVar2 * ZEXT816(4),8) != 0) {
    uVar4 = 0xffffffffffffffff;
  }
  __p_00 = (float *)operator_new__(uVar4);
  memset(__p_00,0,uVar4);
  std::unique_ptr<float[],std::default_delete<float[]>>::
  unique_ptr<float*,std::default_delete<float[]>,void,bool>
            ((unique_ptr<float[],std::default_delete<float[]>> *)&this->work_w_,__p_00);
  local_30 = rtc::CheckGEImpl_abi_cxx11_(local_14,1,"fft_order >= 1");
  if (local_30 != (string *)0x0) {
    rtc::FatalMessage::FatalMessage
              (&local_1a8,
               "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/webrtc/webrtc/common_audio/real_fourier_ooura.cc"
               ,0x2d,local_30);
    rtc::FatalMessage::stream(&local_1a8);
    rtc::FatalMessage::~FatalMessage(&local_1a8);
  }
  return;
}

Assistant:

RealFourierOoura::RealFourierOoura(int fft_order)
    : order_(fft_order),
      length_(FftLength(order_)),
      complex_length_(ComplexLength(order_)),
      // Zero-initializing work_ip_ will cause rdft to initialize these work
      // arrays on the first call.
      work_ip_(new size_t[ComputeWorkIpSize(length_)]()),
      work_w_(new float[complex_length_]()) {
  RTC_CHECK_GE(fft_order, 1);
}